

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

xmlParserErrors xmlLookupCharEncodingHandler(xmlCharEncoding enc,xmlCharEncodingHandler **out)

{
  char *norig;
  xmlParserErrors xVar1;
  
  if (out == (xmlCharEncodingHandler **)0x0) {
    return XML_ERR_ARGUMENT;
  }
  *out = (xmlCharEncodingHandler *)0x0;
  if ((uint)(enc + ~XML_CHAR_ENCODING_8859_16) < 0xffffffe2) {
    return XML_ERR_UNSUPPORTED_ENCODING;
  }
  xVar1 = XML_ERR_OK;
  if (enc != XML_CHAR_ENCODING_UTF8) {
    if ((defaultHandlers[enc].input.func != (xmlCharEncConvFunc)0x0) ||
       (defaultHandlers[enc].output.func != (xmlCharEncConvFunc)0x0)) {
      *out = defaultHandlers + enc;
      return XML_ERR_OK;
    }
    norig = defaultHandlers[enc].name;
    xVar1 = XML_ERR_UNSUPPORTED_ENCODING;
    if (norig != (char *)0x0) {
      xVar1 = xmlFindExtraHandler(norig,norig,XML_ENC_OUTPUT|XML_ENC_INPUT,(xmlCharEncConvImpl)0x0,
                                  (void *)0x0,out);
      return xVar1;
    }
  }
  return xVar1;
}

Assistant:

xmlParserErrors
xmlLookupCharEncodingHandler(xmlCharEncoding enc,
                             xmlCharEncodingHandler **out) {
    const xmlCharEncodingHandler *handler;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;

    if ((enc <= 0) || ((size_t) enc >= NUM_DEFAULT_HANDLERS))
        return(XML_ERR_UNSUPPORTED_ENCODING);

    /* Return NULL handler for UTF-8 */
    if ((enc == XML_CHAR_ENCODING_UTF8) ||
        (enc == XML_CHAR_ENCODING_NONE))
        return(XML_ERR_OK);

    handler = &defaultHandlers[enc];
    if ((handler->input.func != NULL) || (handler->output.func != NULL)) {
        *out = (xmlCharEncodingHandler *) handler;
        return(XML_ERR_OK);
    }

    if (handler->name != NULL) {
        xmlCharEncFlags flags = XML_ENC_INPUT;

#ifdef LIBXML_OUTPUT_ENABLED
        flags |= XML_ENC_OUTPUT;
#endif
        return(xmlFindExtraHandler(handler->name, handler->name, flags,
                                   NULL, NULL, out));
    }

    return(XML_ERR_UNSUPPORTED_ENCODING);
}